

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.cpp
# Opt level: O0

void __thiscall cdns_query::cdns_query(cdns_query *this)

{
  cdns_query *this_local;
  
  this->current_block = (cdnsBlock *)0x0;
  this->time_offset_usec = 0;
  this->client_address_index = -1;
  this->client_port = 0;
  this->transaction_id = 0;
  this->query_signature_index = -1;
  this->client_hoplimit = 0;
  this->delay_useconds = 0;
  this->query_name_index = -1;
  this->query_size = 0;
  this->response_size = 0;
  cdns_response_processing_data::cdns_response_processing_data(&this->rpd);
  cdns_qr_extended::cdns_qr_extended(&this->q_extended);
  cdns_qr_extended::cdns_qr_extended(&this->r_extended);
  return;
}

Assistant:

cdns_query::cdns_query():
    current_block(NULL),
    time_offset_usec(0),
    client_address_index(-1),
    client_port(0),
    transaction_id(0),
    query_signature_index(-1),
    client_hoplimit(0),
    delay_useconds(0),
    query_name_index(-1),
    query_size(0),
    response_size(0)
{
}